

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O2

int __thiscall CLayerTiles::BrushGrab(CLayerTiles *this,CLayerGroup *pBrush,CUIRect Rect)

{
  long lVar1;
  CLayerTiles *this_00;
  int iVar2;
  long lVar3;
  long in_FS_OFFSET;
  RECTi r;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Convert(this,Rect,&r);
  Clamp(this,&r);
  iVar2 = 0;
  if (r.h != 0 && r.w != 0) {
    this_00 = (CLayerTiles *)operator_new(0x80);
    CLayerTiles(this_00,r.w,r.h);
    (this_00->super_CLayer).m_pEditor = (this->super_CLayer).m_pEditor;
    this_00->m_Image = this->m_Image;
    iVar2 = this->m_Game;
    this_00->m_Texture = (CTextureHandle)(this->m_Texture).m_Id;
    this_00->m_Game = iVar2;
    CLayerGroup::AddLayer(pBrush,(CLayer *)this_00);
    if (r.w < 1) {
      r.w = 0;
    }
    iVar2 = 0;
    if (r.h < 1) {
      r.h = 0;
      iVar2 = 0;
    }
    for (; iVar2 != r.h; iVar2 = iVar2 + 1) {
      for (lVar3 = 0; r.w != (int)lVar3; lVar3 = lVar3 + 1) {
        this_00->m_pTiles[(long)this_00->m_Width * (long)iVar2 + lVar3] =
             this->m_pTiles[this->m_Width * r.y + r.x + (int)lVar3];
      }
      r.y = r.y + 1;
    }
    s_lastBrushX = -1;
    s_lastBrushY = -1;
    iVar2 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CLayerTiles::BrushGrab(CLayerGroup *pBrush, CUIRect Rect)
{
	RECTi r;
	Convert(Rect, &r);
	Clamp(&r);

	if(!r.w || !r.h)
		return 0;

	// create new layers
	CLayerTiles *pGrabbed = new CLayerTiles(r.w, r.h);
	pGrabbed->m_pEditor = m_pEditor;
	pGrabbed->m_Texture = m_Texture;
	pGrabbed->m_Image = m_Image;
	pGrabbed->m_Game = m_Game;
	pBrush->AddLayer(pGrabbed);

	// copy the tiles
	for(int y = 0; y < r.h; y++)
		for(int x = 0; x < r.w; x++)
			pGrabbed->m_pTiles[y*pGrabbed->m_Width+x] = m_pTiles[(r.y+y)*m_Width+(r.x+x)];

	s_lastBrushX = -1;
	s_lastBrushY = -1;
	return 1;
}